

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false> this_00;
  FileDescriptor *pFVar2;
  long *plVar3;
  size_type *psVar4;
  FileDescriptor *file;
  int index;
  char *text;
  long lVar5;
  ulong uVar6;
  string filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_data;
  string classname;
  string package;
  FileDescriptorProto file_proto;
  string local_228;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  string local_168;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  
  FileDescriptorProto::FileDescriptorProto(&local_108,(Arena *)0x0,false);
  FileDescriptor::CopyTo(this->file_,&local_108);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_108,&local_168);
  io::Printer::Print<>(printer,"java.lang.String[] descriptorData = {\n");
  io::Printer::Indent(printer);
  if (local_168._M_string_length != 0) {
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        text = ",\n";
        if ((int)((uVar6 & 0xffffffff) / 16000) * -16000 + (int)uVar6 != 0) {
          text = " +\n";
        }
        io::Printer::Print<>(printer,text);
      }
      std::__cxx11::string::substr((ulong)&local_228,(ulong)&local_168);
      CEscape(&local_1c8.first,&local_228);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"\"$data$\"",(char (*) [5])0x3e752c,&local_1c8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != &local_1c8.first.field_2) {
        operator_delete(local_1c8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 0x28;
    } while (uVar6 < local_168._M_string_length);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"\n};\n");
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar2 = this->file_;
  if (0 < *(int *)(pFVar2 + 0x20)) {
    index = 0;
    do {
      pFVar2 = FileDescriptor::dependency(pFVar2,index);
      lVar5 = **(long **)pFVar2;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,lVar5,(*(long **)pFVar2)[1] + lVar5);
      pFVar2 = FileDescriptor::dependency(this->file_,index);
      FileJavaPackage_abi_cxx11_(&local_128,(java *)pFVar2,file);
      this_00._M_head_impl =
           (this->name_resolver_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
           .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
           _M_head_impl;
      pFVar2 = FileDescriptor::dependency(this->file_,index);
      ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&local_148,this_00._M_head_impl,pFVar2);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      if (local_128._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_1e8);
      }
      else {
        local_188[0] = local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,local_128._M_dataplus._M_p,
                   local_128._M_dataplus._M_p + local_128._M_string_length);
        std::__cxx11::string::append((char *)local_188);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_188,(ulong)local_148._M_dataplus._M_p);
        paVar1 = &local_1c8.first.field_2;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_1c8.first.field_2._M_allocated_capacity = *psVar4;
          local_1c8.first.field_2._8_8_ = plVar3[3];
          local_1c8.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1c8.first.field_2._M_allocated_capacity = *psVar4;
          local_1c8.first._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_1c8.first._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c8.first._M_dataplus._M_p);
        }
        if (local_188[0] != local_178) {
          operator_delete(local_188[0]);
        }
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1c8,&local_228,&local_1e8);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_208,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.second._M_dataplus._M_p != &local_1c8.second.field_2) {
        operator_delete(local_1c8.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != &local_1c8.first.field_2) {
        operator_delete(local_1c8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      index = index + 1;
      pFVar2 = this->file_;
    } while (index < *(int *)(pFVar2 + 0x20));
  }
  io::Printer::Print<>
            (printer,
             "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n  .internalBuildGeneratedFileFrom(descriptorData,\n"
            );
  io::Printer::Print<>(printer,"    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");
  if (local_208.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_208.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0x20;
    uVar6 = 0;
    do {
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"      $dependency$.getDescriptor(),\n",(char (*) [11])0x437a9a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((local_208.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar5));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x40;
    } while (uVar6 < (ulong)((long)local_208.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_208.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  io::Printer::Print<>(printer,"    });\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  std::string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print("java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Limit the number of bytes per line.
  static const int kBytesPerLine = 40;
  // Limit the number of lines per string part.
  static const int kLinesPerPart = 400;
  // Every block of bytes, start a new string literal, in order to avoid the
  // 64k length limit. Note that this value needs to be <64k.
  static const int kBytesPerPart = kBytesPerLine * kLinesPerPart;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      if (i % kBytesPerPart == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"", "data",
                   CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<std::string, std::string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    std::string filename = file_->dependency(i)->name();
    std::string package = FileJavaPackage(file_->dependency(i));
    std::string classname =
        name_resolver_->GetDescriptorClassName(file_->dependency(i));
    std::string full_name;
    if (package.empty()) {
      full_name = classname;
    } else {
      full_name = package + "." + classname;
    }
    dependencies.push_back(std::make_pair(filename, full_name));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n"
      "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
      "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const std::string& dependency = dependencies[i].second;
    printer->Print("      $dependency$.getDescriptor(),\n", "dependency",
                   dependency);
  }

  printer->Print("    });\n");
}